

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionPort::IfcDistributionPort(IfcDistributionPort *this)

{
  IfcDistributionPort *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x148,"IfcDistributionPort");
  IfcPort::IfcPort((IfcPort *)this,&PTR_construction_vtable_24__01114d48);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>,
             &PTR_construction_vtable_24__01114e38);
  *(undefined8 *)this = 0x1114c40;
  *(undefined8 *)&this->field_0x148 = 0x1114d30;
  *(undefined8 *)&this->field_0x88 = 0x1114c68;
  *(undefined8 *)&this->field_0x98 = 0x1114c90;
  *(undefined8 *)&this->field_0xd0 = 0x1114cb8;
  *(undefined8 *)&this->field_0x100 = 0x1114ce0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x1114d08;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x10);
  return;
}

Assistant:

IfcDistributionPort() : Object("IfcDistributionPort") {}